

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O2

void aom_highbd_hadamard_16x16_c(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  tran_low_t *coeff_00;
  long lVar6;
  
  uVar3 = 0;
  coeff_00 = coeff;
  for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 4) {
    aom_highbd_hadamard_8x8_c
              (src_diff + (ulong)((uint)lVar6 & 8) * src_stride + (ulong)(uVar3 & 8),src_stride,
               coeff_00);
    coeff_00 = coeff_00 + 0x40;
    uVar3 = uVar3 + 8;
  }
  for (lVar6 = 0; (int)lVar6 != 0x40; lVar6 = lVar6 + 1) {
    iVar5 = coeff[lVar6 + 0x40] + coeff[lVar6] >> 1;
    iVar1 = coeff[lVar6] - coeff[lVar6 + 0x40] >> 1;
    iVar4 = coeff[lVar6 + 0xc0] + coeff[lVar6 + 0x80] >> 1;
    iVar2 = coeff[lVar6 + 0x80] - coeff[lVar6 + 0xc0] >> 1;
    coeff[lVar6] = iVar4 + iVar5;
    coeff[lVar6 + 0x40] = iVar2 + iVar1;
    coeff[lVar6 + 0x80] = iVar5 - iVar4;
    coeff[lVar6 + 0xc0] = iVar1 - iVar2;
  }
  return;
}

Assistant:

void aom_highbd_hadamard_16x16_c(const int16_t *src_diff, ptrdiff_t src_stride,
                                 tran_low_t *coeff) {
  int idx;
  for (idx = 0; idx < 4; ++idx) {
    // src_diff: 13 bit, dynamic range [-4095, 4095]
    const int16_t *src_ptr =
        src_diff + (idx >> 1) * 8 * src_stride + (idx & 0x01) * 8;
    aom_highbd_hadamard_8x8_c(src_ptr, src_stride, coeff + idx * 64);
  }

  // coeff: 19 bit, dynamic range [-262080, 262080]
  for (idx = 0; idx < 64; ++idx) {
    tran_low_t a0 = coeff[0];
    tran_low_t a1 = coeff[64];
    tran_low_t a2 = coeff[128];
    tran_low_t a3 = coeff[192];

    tran_low_t b0 = (a0 + a1) >> 1;
    tran_low_t b1 = (a0 - a1) >> 1;
    tran_low_t b2 = (a2 + a3) >> 1;
    tran_low_t b3 = (a2 - a3) >> 1;

    // new coeff dynamic range: 20 bit
    coeff[0] = b0 + b2;
    coeff[64] = b1 + b3;
    coeff[128] = b0 - b2;
    coeff[192] = b1 - b3;

    ++coeff;
  }
}